

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

void Sfm_TimStop(Sfm_Tim_t *p)

{
  int *piVar1;
  void *__ptr;
  Vec_Int_t *__ptr_00;
  word *__ptr_01;
  long lVar2;
  long lVar3;
  
  piVar1 = (p->vTimArrs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTimArrs).pArray = (int *)0x0;
  }
  (p->vTimArrs).nCap = 0;
  (p->vTimArrs).nSize = 0;
  piVar1 = (p->vTimReqs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vTimReqs).pArray = (int *)0x0;
  }
  (p->vTimReqs).nCap = 0;
  (p->vTimReqs).nSize = 0;
  if (0 < (p->vLevels).nCap) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      __ptr = *(void **)((long)&((p->vLevels).pArray)->nCap + lVar2);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&((p->vLevels).pArray)->nCap + lVar2) = 0;
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar3 < (p->vLevels).nCap);
  }
  __ptr_00 = (p->vLevels).pArray;
  if (__ptr_00 != (Vec_Int_t *)0x0) {
    free(__ptr_00);
    (p->vLevels).pArray = (Vec_Int_t *)0x0;
  }
  (p->vLevels).nCap = 0;
  (p->vLevels).nSize = 0;
  piVar1 = (p->vPath).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPath).pArray = (int *)0x0;
  }
  (p->vPath).nCap = 0;
  (p->vPath).nSize = 0;
  __ptr_01 = (p->vSortData).pArray;
  if (__ptr_01 != (word *)0x0) {
    free(__ptr_01);
    (p->vSortData).pArray = (word *)0x0;
  }
  (p->vSortData).nCap = 0;
  (p->vSortData).nSize = 0;
  if (p != (Sfm_Tim_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sfm_TimStop( Sfm_Tim_t * p )
{
    Vec_IntErase( &p->vTimArrs );
    Vec_IntErase( &p->vTimReqs );
    Vec_WecErase( &p->vLevels );
    Vec_IntErase( &p->vPath );
    Vec_WrdErase( &p->vSortData );
    ABC_FREE( p );
}